

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

bool __thiscall
QFileDialogPrivate::restoreWidgetState
          (QFileDialogPrivate *this,QStringList *history,int splitterPosition)

{
  QFileDialog *this_00;
  QSplitter *this_01;
  QAction *pQVar1;
  bool bVar2;
  parameter_type t;
  int iVar3;
  int iVar4;
  QWidget *pQVar5;
  pointer piVar6;
  iterator abegin;
  iterator iVar7;
  long lVar8;
  QAbstractProxyModel *pQVar9;
  int i;
  undefined1 *puVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  if (splitterPosition < 0) {
    bVar2 = QSplitter::restoreState(((this->qFileDialogUi).d)->splitter,&this->splitterState);
    if (bVar2) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
      QSplitter::sizes((QList<int> *)&local_58,((this->qFileDialogUi).d)->splitter);
      if (((undefined1 *)0x1 < (ulong)local_58.size) &&
         ((*(int *)local_58.ptr == 0 || (*(int *)((long)local_58.ptr + 4) == 0)))) {
        for (puVar10 = (undefined1 *)0x0; this_01 = ((this->qFileDialogUi).d)->splitter,
            puVar10 < (ulong)local_58.size; puVar10 = puVar10 + 1) {
          pQVar5 = QSplitter::widget(this_01,(int)puVar10);
          iVar3 = (**(code **)(*(long *)pQVar5 + 0x70))(pQVar5);
          piVar6 = QList<int>::data((QList<int> *)&local_58);
          piVar6[(long)puVar10] = iVar3;
        }
        QSplitter::setSizes(this_01,(QList<int> *)&local_58);
      }
      goto LAB_00497754;
    }
  }
  else {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QAction **)0x0;
    local_58.size = 0;
    QList<int>::append((QList<int> *)&local_58,splitterPosition);
    pQVar5 = QSplitter::widget(((this->qFileDialogUi).d)->splitter,1);
    t = (**(code **)(*(long *)pQVar5 + 0x70))(pQVar5);
    QList<int>::append((QList<int> *)&local_58,t);
    QSplitter::setSizes(((this->qFileDialogUi).d)->splitter,(QList<int> *)&local_58);
LAB_00497754:
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_58);
    QSidebar::setUrls(((this->qFileDialogUi).d)->sidebar,&this->sidebarUrls);
    if (5 < (ulong)(history->d).size) {
      abegin = QList<QString>::begin(history);
      iVar7 = QList<QString>::end(history);
      QList<QString>::erase(history,(const_iterator)abegin.i,iVar7.i + -5);
    }
    QFileDialog::setHistory(this_00,history);
    pQVar5 = (QWidget *)QTreeView::header(&((this->qFileDialogUi).d)->treeView->super_QTreeView);
    bVar2 = QHeaderView::restoreState((QHeaderView *)pQVar5,&this->headerData);
    if (bVar2) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
      QWidget::actions((QList<QAction_*> *)&local_58,pQVar5);
      pQVar9 = this->proxyModel;
      if (pQVar9 == (QAbstractProxyModel *)0x0) {
        pQVar9 = (QAbstractProxyModel *)this->model;
      }
      iVar4 = (**(code **)(*(long *)pQVar9 + 0x80))();
      iVar3 = (int)local_58.size + 1;
      if (iVar4 < (int)local_58.size + 1) {
        iVar3 = iVar4;
      }
      for (lVar8 = 1; lVar8 < iVar3; lVar8 = lVar8 + 1) {
        pQVar1 = local_58.ptr[lVar8 + -1];
        QHeaderView::isSectionHidden((QHeaderView *)pQVar5,(int)lVar8);
        QAction::setChecked(SUB81(pQVar1,0));
      }
      QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_58);
      bVar2 = true;
      goto LAB_00497864;
    }
  }
  bVar2 = false;
LAB_00497864:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QFileDialogPrivate::restoreWidgetState(QStringList &history, int splitterPosition)
{
    Q_Q(QFileDialog);
    if (splitterPosition >= 0) {
        QList<int> splitterSizes;
        splitterSizes.append(splitterPosition);
        splitterSizes.append(qFileDialogUi->splitter->widget(1)->sizeHint().width());
        qFileDialogUi->splitter->setSizes(splitterSizes);
    } else {
        if (!qFileDialogUi->splitter->restoreState(splitterState))
            return false;
        QList<int> list = qFileDialogUi->splitter->sizes();
        if (list.size() >= 2 && (list.at(0) == 0 || list.at(1) == 0)) {
            for (int i = 0; i < list.size(); ++i)
                list[i] = qFileDialogUi->splitter->widget(i)->sizeHint().width();
            qFileDialogUi->splitter->setSizes(list);
        }
    }

    qFileDialogUi->sidebar->setUrls(sidebarUrls);

    static const int MaxHistorySize = 5;
    if (history.size() > MaxHistorySize)
        history.erase(history.begin(), history.end() - MaxHistorySize);
    q->setHistory(history);

    QHeaderView *headerView = qFileDialogUi->treeView->header();
    if (!headerView->restoreState(headerData))
        return false;

    QList<QAction*> actions = headerView->actions();
    QAbstractItemModel *abstractModel = model;
#if QT_CONFIG(proxymodel)
    if (proxyModel)
        abstractModel = proxyModel;
#endif
    const int total = qMin(abstractModel->columnCount(QModelIndex()), int(actions.size() + 1));
    for (int i = 1; i < total; ++i)
        actions.at(i - 1)->setChecked(!headerView->isSectionHidden(i));

    return true;
}